

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::ReplicatedAssignmentPatternSyntax::setChild
          (ReplicatedAssignmentPatternSyntax *this,size_t index,TokenOrSyntax child)

{
  size_type sVar1;
  SyntaxNode *pSVar2;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *pSVar3;
  logic_error *this_00;
  Token TVar4;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (index < 6) {
    switch(index) {
    case 0:
      TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->openBrace).kind = TVar4.kind;
      (this->openBrace).field_0x2 = TVar4._2_1_;
      (this->openBrace).numFlags = (NumericTokenFlags)TVar4.numFlags.raw;
      (this->openBrace).rawLen = TVar4.rawLen;
      (this->openBrace).info = TVar4.info;
      break;
    case 1:
      pSVar2 = TokenOrSyntax::node(&child);
      if (pSVar2 == (SyntaxNode *)0x0) {
        local_d8._M_dataplus._M_p = (pointer)0x0;
      }
      else {
        pSVar2 = TokenOrSyntax::node(&child);
        local_d8._M_dataplus._M_p = (pointer)SyntaxNode::as<slang::syntax::ExpressionSyntax>(pSVar2)
        ;
      }
      not_null<slang::syntax::ExpressionSyntax*>::not_null<slang::syntax::ExpressionSyntax*,void>
                ((not_null<slang::syntax::ExpressionSyntax*> *)&local_b8,
                 (ExpressionSyntax **)&local_d8);
      (this->countExpr).ptr = (ExpressionSyntax *)local_b8._M_dataplus._M_p;
      break;
    case 2:
      TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->innerOpenBrace).kind = TVar4.kind;
      (this->innerOpenBrace).field_0x2 = TVar4._2_1_;
      (this->innerOpenBrace).numFlags = (NumericTokenFlags)TVar4.numFlags.raw;
      (this->innerOpenBrace).rawLen = TVar4.rawLen;
      (this->innerOpenBrace).info = TVar4.info;
      break;
    case 3:
      pSVar2 = TokenOrSyntax::node(&child);
      pSVar3 = SyntaxNode::as<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>>
                         (pSVar2);
      (this->items).super_SyntaxListBase.super_SyntaxNode.parent =
           (pSVar3->super_SyntaxListBase).super_SyntaxNode.parent;
      (this->items).super_SyntaxListBase.super_SyntaxNode.kind =
           (pSVar3->super_SyntaxListBase).super_SyntaxNode.kind;
      (this->items).super_SyntaxListBase.childCount = (pSVar3->super_SyntaxListBase).childCount;
      sVar1 = (pSVar3->elements).size_;
      (this->items).elements.data_ = (pSVar3->elements).data_;
      (this->items).elements.size_ = sVar1;
      break;
    case 4:
      TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->innerCloseBrace).kind = TVar4.kind;
      (this->innerCloseBrace).field_0x2 = TVar4._2_1_;
      (this->innerCloseBrace).numFlags = (NumericTokenFlags)TVar4.numFlags.raw;
      (this->innerCloseBrace).rawLen = TVar4.rawLen;
      (this->innerCloseBrace).info = TVar4.info;
      break;
    case 5:
      TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->closeBrace).kind = TVar4.kind;
      (this->closeBrace).field_0x2 = TVar4._2_1_;
      (this->closeBrace).numFlags = (NumericTokenFlags)TVar4.numFlags.raw;
      (this->closeBrace).rawLen = TVar4.rawLen;
      (this->closeBrace).info = TVar4.info;
    }
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O2/extern/slang/source/AllSyntax.cpp"
             ,&local_d9);
  std::operator+(&local_58,&local_78,":");
  std::__cxx11::to_string(&local_98,0x2b85);
  std::operator+(&local_38,&local_58,&local_98);
  std::operator+(&local_d8,&local_38,": ");
  std::operator+(&local_b8,&local_d8,"Default case should be unreachable!");
  std::logic_error::logic_error(this_00,(string *)&local_b8);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void ReplicatedAssignmentPatternSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: openBrace = child.token(); return;
        case 1: countExpr = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 2: innerOpenBrace = child.token(); return;
        case 3: items = child.node()->as<SeparatedSyntaxList<ExpressionSyntax>>(); return;
        case 4: innerCloseBrace = child.token(); return;
        case 5: closeBrace = child.token(); return;
        default: ASSUME_UNREACHABLE;
    }
}